

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

CURLcode cf_hc_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  _Bool _Var1;
  CURLcode CVar2;
  byte local_49;
  cf_hc_baller *pcStack_48;
  _Bool bdone;
  cf_hc_baller *b;
  ulong uStack_38;
  CURLcode result;
  size_t i;
  cf_hc_ctx *ctx;
  _Bool *done_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  i = (size_t)cf->ctx;
  b._4_4_ = CURLE_OK;
  if ((cf->field_0x24 & 1) == 0) {
    ctx = (cf_hc_ctx *)done;
    done_local = (_Bool *)data;
    data_local = (Curl_easy *)cf;
    for (uStack_38 = 0; uStack_38 < *(ulong *)(i + 0x98); uStack_38 = uStack_38 + 1) {
      pcStack_48 = (cf_hc_baller *)(i + 0x28 + uStack_38 * 0x38);
      local_49 = 0;
      _Var1 = cf_hc_baller_is_active(pcStack_48);
      if ((_Var1) && ((pcStack_48->field_0x30 & 1) == 0)) {
        CVar2 = (*(code *)pcStack_48->cf->cft->do_shutdown)(pcStack_48->cf,done_local,&local_49);
        pcStack_48->result = CVar2;
        if ((pcStack_48->result != CURLE_OK) || ((local_49 & 1) != 0)) {
          pcStack_48->field_0x30 = pcStack_48->field_0x30 & 0xfe | 1;
        }
      }
    }
    *(undefined1 *)&ctx->state = CF_HC_CONNECT;
    for (uStack_38 = 0; uStack_38 < *(ulong *)(i + 0x98); uStack_38 = uStack_38 + 1) {
      if ((*(byte *)(i + uStack_38 * 0x38 + 0x58) & 1) == 0) {
        *(undefined1 *)&ctx->state = CF_HC_INIT;
      }
    }
    if ((ctx->state & CF_HC_CONNECT) != CF_HC_INIT) {
      for (uStack_38 = 0; uStack_38 < *(ulong *)(i + 0x98); uStack_38 = uStack_38 + 1) {
        if (*(int *)(i + uStack_38 * 0x38 + 0x38) != 0) {
          b._4_4_ = *(CURLcode *)(i + uStack_38 * 0x38 + 0x38);
        }
      }
    }
    if ((((done_local != (_Bool *)0x0) && ((*(ulong *)(done_local + 0xa34) >> 0x1e & 1) != 0)) &&
        ((*(long *)(done_local + 0x1318) == 0 || (0 < *(int *)(*(long *)(done_local + 0x1318) + 8)))
        )) && ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
      Curl_trc_cf_infof((Curl_easy *)done_local,(Curl_cfilter *)data_local,"shutdown -> %d, done=%d"
                        ,(ulong)b._4_4_,(ulong)(byte)((char)ctx->state & CF_HC_CONNECT));
    }
    cf_local._4_4_ = b._4_4_;
  }
  else {
    *done = true;
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode cf_hc_shutdown(struct Curl_cfilter *cf,
                               struct Curl_easy *data, bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  size_t i;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* shutdown all ballers that have not done so already. If one fails,
   * continue shutting down others until all are shutdown. */
  for(i = 0; i < ctx->baller_count; i++) {
    struct cf_hc_baller *b = &ctx->ballers[i];
    bool bdone = FALSE;
    if(!cf_hc_baller_is_active(b) || b->shutdown)
      continue;
    b->result = b->cf->cft->do_shutdown(b->cf, data, &bdone);
    if(b->result || bdone)
      b->shutdown = TRUE; /* treat a failed shutdown as done */
  }

  *done = TRUE;
  for(i = 0; i < ctx->baller_count; i++) {
    if(!ctx->ballers[i].shutdown)
      *done = FALSE;
  }
  if(*done) {
    for(i = 0; i < ctx->baller_count; i++) {
      if(ctx->ballers[i].result)
        result = ctx->ballers[i].result;
    }
  }
  CURL_TRC_CF(data, cf, "shutdown -> %d, done=%d", result, *done);
  return result;
}